

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8to4_int8.h
# Opt level: O1

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse
               (Mat *kernel,Mat *kernel_tm_pack8,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  size_t sVar14;
  size_t sVar15;
  undefined1 auVar16 [16];
  int *piVar17;
  int iVar18;
  void *pvVar19;
  ulong uVar20;
  long lVar21;
  undefined2 *puVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  void *pvVar27;
  undefined2 *puVar28;
  uint *puVar29;
  long lVar30;
  undefined4 uVar31;
  undefined2 *puVar32;
  long lVar33;
  undefined2 *puVar34;
  short tmp [6] [3];
  ulong local_110;
  void *local_d8;
  Mat local_c8;
  void *local_78;
  long local_70;
  ulong local_68;
  undefined8 local_60;
  short sStack_58;
  uint auStack_56 [9];
  
  iVar18 = cpu_support_x86_avx2();
  if (iVar18 != 0) {
    conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avx2
              (kernel,kernel_tm_pack8,inch,outch,opt);
    return;
  }
  iVar18 = cpu_support_x86_xop();
  if (iVar18 != 0) {
    conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop
              (kernel,kernel_tm_pack8,inch,outch,opt);
    return;
  }
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize = 0;
  local_c8.elempack = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,0x24,inch,outch,2,(Allocator *)0x0);
  if (0 < outch) {
    local_78 = kernel->data;
    local_d8 = local_c8.data;
    local_70 = local_c8.cstep * local_c8.elemsize;
    local_60 = (long)local_c8.w * local_c8.elemsize;
    local_110 = 0;
    do {
      if (0 < inch) {
        iVar18 = inch * 9 * (int)local_110;
        uVar20 = 0;
        pvVar27 = local_d8;
        do {
          lVar24 = uVar20 * 9;
          cVar1 = *(char *)((long)local_78 + lVar24 + iVar18);
          cVar2 = *(char *)((long)local_78 + lVar24 + (long)iVar18 + 1);
          cVar3 = *(char *)((long)local_78 + lVar24 + (long)iVar18 + 2);
          cVar4 = *(char *)((long)local_78 + lVar24 + (long)iVar18 + 3);
          cVar5 = *(char *)((long)local_78 + lVar24 + (long)iVar18 + 4);
          cVar6 = *(char *)((long)local_78 + lVar24 + (long)iVar18 + 5);
          cVar7 = *(char *)((long)local_78 + lVar24 + (long)iVar18 + 6);
          cVar8 = *(char *)((long)local_78 + lVar24 + (long)iVar18 + 7);
          cVar9 = *(char *)((long)local_78 + lVar24 + (long)iVar18 + 8);
          lVar24 = 4;
          do {
            sVar10 = *(short *)("N4ncnn19Convolution_x86_fmaE" + lVar24 + 0x1c);
            sVar11 = *(short *)(&UNK_0059713e + lVar24);
            sVar12 = *(short *)((long)&DAT_00597140 + lVar24);
            *(short *)((long)&local_60 + lVar24 + 4) =
                 sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1;
            *(short *)((long)&local_60 + lVar24 + 6) =
                 sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4;
            *(short *)((long)auStack_56 + lVar24 + -2) =
                 sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
            lVar24 = lVar24 + 6;
          } while (lVar24 != 0x28);
          lVar24 = 0;
          pvVar19 = pvVar27;
          do {
            sVar10 = *(short *)((long)auStack_56 + lVar24 * 6 + -2);
            uVar13 = *(uint *)((long)auStack_56 + lVar24 * 6);
            puVar29 = &DAT_00597142;
            lVar30 = 0;
            do {
              auVar16 = vpmullw_avx(ZEXT416(*puVar29),ZEXT416(uVar13));
              uVar31 = vpextrw_avx(auVar16,1);
              *(short *)((long)pvVar19 + lVar30 * 2) =
                   (short)uVar31 + auVar16._0_2_ + *(short *)((long)puVar29 + -2) * sVar10;
              lVar30 = lVar30 + 1;
              puVar29 = (uint *)((long)puVar29 + 6);
            } while (lVar30 != 6);
            lVar24 = lVar24 + 1;
            pvVar19 = (void *)((long)pvVar19 + 0xc);
          } while (lVar24 != 6);
          uVar20 = uVar20 + 1;
          pvVar27 = (void *)((long)pvVar27 + local_60);
        } while (uVar20 != (uint)inch);
      }
      local_110 = local_110 + 1;
      local_d8 = (void *)((long)local_d8 + local_70);
      local_68 = (ulong)(uint)inch;
    } while (local_110 != (uint)outch);
  }
  iVar18 = inch + 7;
  if (-1 < inch) {
    iVar18 = inch;
  }
  iVar23 = outch + 3;
  if (-1 < outch) {
    iVar23 = outch;
  }
  Mat::create(kernel_tm_pack8,iVar18 >> 3,0x24,iVar23 >> 2,0x40,0x20,(Allocator *)0x0);
  if (3 < outch) {
    iVar18 = kernel_tm_pack8->w;
    pvVar27 = kernel_tm_pack8->data;
    sVar14 = kernel_tm_pack8->elemsize;
    sVar15 = kernel_tm_pack8->cstep;
    uVar20 = 0;
    do {
      puVar32 = (undefined2 *)(local_c8.cstep * local_c8.elemsize * uVar20 + (long)local_c8.data);
      lVar24 = 0;
      do {
        if (7 < inch) {
          lVar30 = (long)pvVar27 + (long)iVar18 * sVar14 * lVar24 + (uVar20 >> 2) * sVar15 * sVar14;
          puVar28 = puVar32;
          lVar33 = 0;
          do {
            lVar25 = 0;
            puVar34 = puVar28;
            do {
              lVar21 = lVar30;
              lVar30 = 0;
              puVar22 = puVar34;
              do {
                *(undefined2 *)(lVar21 + lVar30) = *puVar22;
                puVar22 = (undefined2 *)((long)puVar22 + (long)local_c8.w * local_c8.elemsize);
                lVar30 = lVar30 + 2;
              } while (lVar30 != 0x10);
              lVar25 = lVar25 + 1;
              puVar34 = (undefined2 *)((long)puVar34 + local_c8.cstep * local_c8.elemsize);
              lVar30 = lVar21 + 0x10;
            } while (lVar25 != 4);
            lVar25 = lVar33 + 0xf;
            puVar28 = puVar28 + (long)local_c8.w * local_c8.elemsize * 4;
            lVar30 = lVar21 + 0x10;
            lVar33 = lVar33 + 8;
          } while (lVar25 < inch);
        }
        lVar24 = lVar24 + 1;
        puVar32 = puVar32 + 1;
      } while (lVar24 != 0x24);
      uVar26 = uVar20 + 7;
      uVar20 = uVar20 + 4;
    } while (uVar26 < (uint)outch);
  }
  piVar17 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(const Mat& kernel, Mat& kernel_tm_pack8, int inch, int outch, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avx512vnni(kernel, kernel_tm_pack8, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avxvnni(kernel, kernel_tm_pack8, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avx2(kernel, kernel_tm_pack8, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop(kernel, kernel_tm_pack8, inch, outch, opt);
        return;
    }
#endif
#endif

    // winograd43 transform kernel
    Mat kernel_tm(6 * 6, inch, outch, (size_t)2u);

    const short ktm[6][3] = {
        {6, 0, 0},
        {-4, -4, -4},
        {-4, 4, -4},
        {1, 2, 4},
        {1, -2, 4},
        {0, 0, 6}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const signed char* kernel0 = (const signed char*)kernel + p * inch * 9 + q * 9;
            short* kernel_tm0 = kernel_tm.channel(p).row<short>(q);

            // transform kernel
            const signed char* k0 = kernel0;
            const signed char* k1 = kernel0 + 3;
            const signed char* k2 = kernel0 + 6;

            // h
            short tmp[6][3];
            for (int i = 0; i < 6; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 6; j++)
            {
                short* tmpp = &tmp[j][0];

                for (int i = 0; i < 6; i++)
                {
                    kernel_tm0[j * 6 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 36-inch-outch
    // dst = 4b-8a-inch/8a-36-outch/4b
    kernel_tm_pack8.create(inch / 8, 36, outch / 4, (size_t)2u * 32, 32);

    int q = 0;
    for (; q + 3 < outch; q += 4)
    {
        Mat g0 = kernel_tm_pack8.channel(q / 4);

        for (int k = 0; k < 36; k++)
        {
            short* g00 = g0.row<short>(k);

            for (int p = 0; p + 7 < inch; p += 8)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const short* k00 = kernel_tm.channel(q + i).row<const short>(p + j);
                        g00[0] = k00[k];
                        g00 += 1;
                    }
                }
            }
        }
    }
}